

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void __thiscall FBehavior::UnencryptStrings(FBehavior *this)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  BYTE *pBVar4;
  BYTE *chunk;
  BYTE *pBVar5;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  
  pBVar4 = FindChunk(this,0x45525453);
  pBVar5 = (BYTE *)0x0;
  while (chunk = pBVar4, chunk != (BYTE *)0x0) {
    for (uVar6 = 0; uVar6 < *(uint *)(chunk + 0xc); uVar6 = uVar6 + 1) {
      iVar2 = *(int *)(chunk + (ulong)((int)uVar6 + 5) * 4);
      lVar3 = (long)iVar2 + 8;
      uVar7 = 0;
      do {
        bVar8 = (char)(uVar7 >> 1) + (char)iVar2 * -0x31;
        bVar1 = chunk[uVar7 + lVar3];
        chunk[uVar7 + lVar3] = bVar1 ^ bVar8;
        uVar7 = uVar7 + 1;
      } while (bVar1 != bVar8);
    }
    pBVar4 = NextChunk(this,chunk);
    builtin_memcpy(chunk,"STRL",4);
    pBVar5 = chunk;
  }
  if (pBVar5 != (BYTE *)0x0) {
    builtin_memcpy(pBVar5,"STRL",4);
  }
  return;
}

Assistant:

void FBehavior::UnencryptStrings ()
{
	DWORD *prevchunk = NULL;
	DWORD *chunk = (DWORD *)FindChunk(MAKE_ID('S','T','R','E'));
	while (chunk != NULL)
	{
		for (DWORD strnum = 0; strnum < LittleLong(chunk[3]); ++strnum)
		{
			int ofs = LittleLong(chunk[5+strnum]);
			BYTE *data = (BYTE *)chunk + ofs + 8, last;
			int p = (BYTE)(ofs*157135);
			int i = 0;
			do
			{
				last = (data[i] ^= (BYTE)(p+(i>>1)));
				++i;
			} while (last != 0);
		}
		prevchunk = chunk;
		chunk = (DWORD *)NextChunk ((BYTE *)chunk);
		*prevchunk = MAKE_ID('S','T','R','L');
	}
	if (prevchunk != NULL)
	{
		*prevchunk = MAKE_ID('S','T','R','L');
	}
}